

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O2

void h2v1_merged_upsample_565D
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  jpeg_upsampler *pjVar5;
  JSAMPLE *pJVar6;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var7;
  long lVar8;
  _func_void_j_decompress_ptr *p_Var9;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var10;
  JSAMPROW pJVar11;
  JSAMPROW pJVar12;
  JSAMPROW pJVar13;
  JSAMPROW pJVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  
  pjVar5 = cinfo->upsample;
  pJVar6 = cinfo->sample_range_limit;
  p_Var7 = pjVar5[1].upsample;
  lVar8 = *(long *)&pjVar5[1].need_context_rows;
  p_Var9 = pjVar5[2].start_pass;
  p_Var10 = pjVar5[2].upsample;
  uVar4 = cinfo->output_width;
  uVar21 = dither_matrix[cinfo->output_scanline & 3];
  pJVar11 = (*input_buf)[in_row_group_ctr];
  pJVar12 = input_buf[1][in_row_group_ctr];
  pJVar13 = input_buf[2][in_row_group_ctr];
  pJVar14 = *output_buf;
  for (lVar15 = 0; uVar4 >> 1 != (uint)lVar15; lVar15 = lVar15 + 1) {
    uVar17 = (ulong)pJVar12[lVar15];
    uVar23 = (ulong)pJVar13[lVar15];
    lVar16 = (long)*(int *)(p_Var7 + uVar23 * 4);
    lVar19 = (long)*(int *)(lVar8 + uVar17 * 4);
    uVar18 = (ulong)pJVar11[lVar15 * 2];
    uVar22 = uVar21 & 0xff;
    lVar20 = (long)(int)((ulong)(*(long *)(p_Var9 + uVar23 * 8) + *(long *)(p_Var10 + uVar17 * 8))
                        >> 0x10);
    uVar24 = (uint)(uVar21 >> 8);
    uVar17 = (ulong)pJVar11[lVar15 * 2 + 1];
    uVar23 = uVar21 >> 8 & 0xff;
    bVar1 = pJVar6[lVar20 + uVar17 + (uVar23 >> 1)];
    bVar2 = pJVar6[lVar16 + uVar17 + uVar23];
    bVar3 = pJVar6[lVar19 + uVar17 + uVar23];
    uVar21 = (ulong)(uVar24 << 0x18 | (uVar24 & 0xffff00 | (int)uVar21 << 0x18) >> 8);
    *(ushort *)(pJVar14 + lVar15 * 4) =
         (ushort)(pJVar6[uVar18 + lVar19 + uVar22] >> 3) |
         (pJVar6[uVar18 + lVar16 + uVar22] & 0xfff8) * 0x100 +
         (pJVar6[uVar18 + lVar20 + (uVar22 >> 1)] & 0xfc) * 8;
    *(ushort *)(pJVar14 + lVar15 * 4 + 2) =
         (ushort)(bVar3 >> 3) | (bVar2 & 0xfff8) * 0x100 + (bVar1 & 0xfc) * 8;
  }
  if ((uVar4 & 1) != 0) {
    uVar17 = (ulong)pJVar12[lVar15];
    uVar18 = (ulong)pJVar13[lVar15];
    uVar23 = (ulong)pJVar11[lVar15 * 2];
    uVar21 = uVar21 & 0xff;
    *(ushort *)(pJVar14 + lVar15 * 4) =
         (ushort)(pJVar6[(long)*(int *)(lVar8 + uVar17 * 4) + uVar23 + uVar21] >> 3) |
         (pJVar6[(long)*(int *)(p_Var7 + uVar18 * 4) + uVar23 + uVar21] & 0xfff8) * 0x100 +
         (pJVar6[(long)(int)((ulong)(*(long *)(p_Var9 + uVar18 * 8) +
                                    *(long *)(p_Var10 + uVar17 * 8)) >> 0x10) + uVar23 +
                 (uVar21 >> 1)] & 0xfc) * 8;
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample_565D(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                          JDIMENSION in_row_group_ctr, JSAMPARRAY output_buf)
{
  if (is_big_endian())
    h2v1_merged_upsample_565D_be(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
  else
    h2v1_merged_upsample_565D_le(cinfo, input_buf, in_row_group_ctr,
                                 output_buf);
}